

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O2

void printOptionExportValues(TidyDoc tdoc,TidyOption topt,OptionDesc *d)

{
  uint uVar1;
  TidyOptionId optId;
  TidyConfigCategory TVar2;
  TidyIterator p_Var3;
  ctmbstr ptVar4;
  size_t sVar5;
  TidyAllocator *pTVar6;
  ulong uVar7;
  TidyBuffer *buf;
  byte *__s;
  TidyIterator pos;
  TidyBuffer buf2;
  TidyBuffer buf1;
  
  optId = tidyOptGetId(topt);
  TVar2 = tidyOptGetCategory(topt);
  if (TVar2 == TidyInternalCategory) {
    return;
  }
  uVar1 = optId - TidyBlockTags;
  if (uVar1 < 0x3e) {
    if ((0x1000000400010001U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      if (((ulong)uVar1 != 0x3d) ||
         (pTVar6 = (TidyAllocator *)tidyOptGetPriorityAttrList(tdoc), buf2.allocator = pTVar6,
         (undefined1 *)((long)&pTVar6->vtbl + 1) < (undefined1 *)0x2)) goto LAB_00132f8c;
      tidyBufInit(&buf1);
      while (pTVar6 != (TidyAllocator *)0x0) {
        ptVar4 = tidyOptGetNextPriorityAttr(tdoc,(TidyIterator *)&buf2);
        d->def = ptVar4;
        pTVar6 = buf2.allocator;
        if (ptVar4 != (ctmbstr)0x0) {
          if (buf1.size != 0) {
            tidyBufAppend(&buf1," ",1);
            ptVar4 = d->def;
          }
          sVar5 = strlen(ptVar4);
          tidyBufAppend(&buf1,ptVar4,(uint)sVar5);
          pTVar6 = buf2.allocator;
        }
      }
      buf = &buf1;
      tidyBufAppend(buf,"",1);
      printf("%s: %s\n",d->name,buf1.bp);
      d->name = "";
      d->type = "";
      d->def = (ctmbstr)0x0;
    }
    else {
      p_Var3 = tidyOptGetDeclTagList(tdoc);
      pos = p_Var3;
      if (p_Var3 == (TidyIterator)0x0) goto LAB_00132f8c;
      tidyBufInit(&buf1);
      tidyBufInit(&buf2);
      while (p_Var3 != (TidyIterator)0x0) {
        ptVar4 = tidyOptGetNextDeclTag(tdoc,optId,&pos);
        d->def = ptVar4;
        p_Var3 = pos;
        if (ptVar4 != (ctmbstr)0x0) {
          if (buf1.size != 0) {
            tidyBufAppend(&buf1," ",1);
            ptVar4 = d->def;
          }
          sVar5 = strlen(ptVar4);
          tidyBufAppend(&buf1,ptVar4,(uint)sVar5);
          p_Var3 = pos;
        }
      }
      if (buf1.bp != (byte *)0x0) {
        uVar7 = (ulong)buf1.size;
        __s = buf1.bp + uVar7;
        while (uVar7 = uVar7 - 1, uVar7 != 0xffffffffffffffff) {
          if (buf1.bp[uVar7 & 0xffffffff] == ' ') {
            buf1.bp[uVar7 & 0xffffffff] = '\0';
            if (buf2.size != 0) {
              tidyBufAppend(&buf2," ",1);
            }
            sVar5 = strlen((char *)__s);
            tidyBufAppend(&buf2,__s,(uint)sVar5);
          }
          __s = __s + -1;
        }
        if (buf2.size != 0) {
          tidyBufAppend(&buf2," ",1);
        }
        sVar5 = strlen((char *)buf1.bp);
        tidyBufAppend(&buf2,buf1.bp,(uint)sVar5);
      }
      buf = &buf2;
      tidyBufAppend(buf,"",1);
      printf("%s: %s\n",d->name,buf2.bp);
      d->name = "";
      d->type = "";
      d->def = (ctmbstr)0x0;
      tidyBufFree(&buf1);
    }
    tidyBufFree(buf);
  }
LAB_00132f8c:
  if (((*d->name != '\0') || (*d->type != '\0')) || ((d->def != (char *)0x0 && (*d->def != '\0'))))
  {
    if (d->def == (ctmbstr)0x0) {
      d->def = "";
    }
    printf("%s: %s\n");
  }
  return;
}

Assistant:

static void printOptionExportValues(TidyDoc ARG_UNUSED(tdoc),  /**< The Tidy document. */
                                    TidyOption topt,           /**< The option for which to show values. */
                                    OptionDesc *d              /**< The OptionDesc array. */
                                    )
{
    TidyOptionId optId = tidyOptGetId( topt );
    TidyBuffer buf1, buf2;

    if ( tidyOptGetCategory(topt) == TidyInternalCategory )
        return;

    switch ( optId )
    {
        case TidyInlineTags:
        case TidyBlockTags:
        case TidyEmptyTags:
        case TidyPreTags:
        {
            TidyIterator pos = tidyOptGetDeclTagList( tdoc );
            if ( pos )  /* Is #697 - one or more values */
            {
                tidyBufInit(&buf1);
                tidyBufInit(&buf2);
                while (pos)
                {
                    d->def = tidyOptGetNextDeclTag(tdoc, optId, &pos);
                    if (d->def)
                    {
                        if (buf1.size)
                            tidyBufAppend(&buf1, " ", 1);
                        tidyBufAppend(&buf1, (void *)d->def, strlen(d->def));
                    }
                }
                invertBuffer(&buf1, &buf2); /* Is #697 - specialised service to invert words */
                tidyBufAppend(&buf2, (void *)"\0", 1); /* is this really required? */
                printf("%s: %s\n", d->name, buf2.bp);
                d->name = "";
                d->type = "";
                d->def = 0;
                tidyBufFree(&buf1);
                tidyBufFree(&buf2);
            }
        }
            break;
        case TidyPriorityAttributes: /* Is #697 - This case seems missing */
        {
            TidyIterator itAttr = tidyOptGetPriorityAttrList(tdoc);
            if (itAttr && (itAttr != (TidyIterator)-1))
            {
                tidyBufInit(&buf1);
                while (itAttr)
                {
                    d->def = tidyOptGetNextPriorityAttr(tdoc, &itAttr);
                    if (d->def)
                    {
                        if (buf1.size)
                            tidyBufAppend(&buf1, " ", 1);
                        tidyBufAppend(&buf1, (void *)d->def, strlen(d->def));
                    }
                }
                tidyBufAppend(&buf1, (void *)"\0", 1); /* is this really required? */
                printf("%s: %s\n", d->name, buf1.bp);
                d->name = "";
                d->type = "";
                d->def = 0;
                tidyBufFree(&buf1);
            }
        }
        break;
        default:
            break;
    }

    /* fix for http://tidy.sf.net/bug/873921 */
    if ( *d->name || *d->type || (d->def && *d->def) )
    {
        if ( ! d->def )
            d->def = "";
        printf( "%s: %s\n", d->name, d->def );
    }
}